

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorClassifier::SupportVectorClassifier
          (SupportVectorClassifier *this,SupportVectorClassifier *from)

{
  int iVar1;
  void *pvVar2;
  Kernel *from_00;
  Kernel *this_00;
  SparseSupportVectors *this_01;
  DenseSupportVectors *this_02;
  StringVector *this_03;
  Int64Vector *this_04;
  StringVector *from_01;
  Int64Vector *from_02;
  SparseSupportVectors *from_03;
  DenseSupportVectors *from_04;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorClassifier_003db6d0
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->numberofsupportvectorsperclass_).current_size_ = 0;
  (this->numberofsupportvectorsperclass_).total_size_ = 0;
  (this->numberofsupportvectorsperclass_).rep_ = (Rep *)0x0;
  iVar1 = (from->numberofsupportvectorsperclass_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<int>::Reserve(&this->numberofsupportvectorsperclass_,iVar1);
    memcpy(((this->numberofsupportvectorsperclass_).rep_)->elements,
           ((from->numberofsupportvectorsperclass_).rep_)->elements,
           (long)(from->numberofsupportvectorsperclass_).current_size_ << 2);
    (this->numberofsupportvectorsperclass_).current_size_ =
         (from->numberofsupportvectorsperclass_).current_size_;
  }
  (this->coefficients_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->coefficients_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->coefficients_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->coefficients_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
            (&(this->coefficients_).super_RepeatedPtrFieldBase,
             &(from->coefficients_).super_RepeatedPtrFieldBase);
  (this->rho_).current_size_ = 0;
  (this->rho_).total_size_ = 0;
  (this->rho_).rep_ = (Rep *)0x0;
  iVar1 = (from->rho_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->rho_,iVar1);
    memcpy(((this->rho_).rep_)->elements,((from->rho_).rep_)->elements,
           (long)(from->rho_).current_size_ << 3);
    (this->rho_).current_size_ = (from->rho_).current_size_;
  }
  (this->proba_).current_size_ = 0;
  (this->proba_).total_size_ = 0;
  (this->proba_).rep_ = (Rep *)0x0;
  iVar1 = (from->proba_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->proba_,iVar1);
    memcpy(((this->proba_).rep_)->elements,((from->proba_).rep_)->elements,
           (long)(from->proba_).current_size_ << 3);
    (this->proba_).current_size_ = (from->proba_).current_size_;
  }
  (this->probb_).current_size_ = 0;
  (this->probb_).total_size_ = 0;
  (this->probb_).rep_ = (Rep *)0x0;
  iVar1 = (from->probb_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->probb_,iVar1);
    memcpy(((this->probb_).rep_)->elements,((from->probb_).rep_)->elements,
           (long)(from->probb_).current_size_ << 3);
    (this->probb_).current_size_ = (from->probb_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->kernel_;
  if (from_00 == (Kernel *)0x0 ||
      from == (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    this_00 = (Kernel *)0x0;
  }
  else {
    this_00 = (Kernel *)operator_new(0x20);
    Kernel::Kernel(this_00,from_00);
  }
  this->kernel_ = this_00;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 4) {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 4;
    this_02 = (DenseSupportVectors *)operator_new(0x30);
    DenseSupportVectors::DenseSupportVectors(this_02);
    (this->supportVectors_).densesupportvectors_ = this_02;
    if (from->_oneof_case_[0] == 4) {
      from_04 = (from->supportVectors_).densesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_04 = (DenseSupportVectors *)&_DenseSupportVectors_default_instance_;
    }
    DenseSupportVectors::MergeFrom(this_02,from_04);
  }
  else if (from->_oneof_case_[0] == 3) {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 3;
    this_01 = (SparseSupportVectors *)operator_new(0x30);
    SparseSupportVectors::SparseSupportVectors(this_01);
    (this->supportVectors_).sparsesupportvectors_ = this_01;
    if (from->_oneof_case_[0] == 3) {
      from_03 = (from->supportVectors_).sparsesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (SparseSupportVectors *)&_SparseSupportVectors_default_instance_;
    }
    SparseSupportVectors::MergeFrom(this_01,from_03);
  }
  this->_oneof_case_[1] = 0;
  if (from->_oneof_case_[1] == 0x65) {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 0x65;
    this_04 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_04);
    (this->ClassLabels_).int64classlabels_ = this_04;
    if (from->_oneof_case_[1] == 0x65) {
      from_02 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_02 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_04,from_02);
  }
  else if (from->_oneof_case_[1] == 100) {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 100;
    this_03 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_03);
    (this->ClassLabels_).stringclasslabels_ = this_03;
    if (from->_oneof_case_[1] == 100) {
      from_01 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_01 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_03,from_01);
  }
  return;
}

Assistant:

SupportVectorClassifier::SupportVectorClassifier(const SupportVectorClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      numberofsupportvectorsperclass_(from.numberofsupportvectorsperclass_),
      coefficients_(from.coefficients_),
      rho_(from.rho_),
      proba_(from.proba_),
      probb_(from.probb_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_kernel()) {
    kernel_ = new ::CoreML::Specification::Kernel(*from.kernel_);
  } else {
    kernel_ = NULL;
  }
  clear_has_supportVectors();
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SupportVectorClassifier)
}